

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenize.h
# Opt level: O0

uint get_token_alloc(int mb_rows,int mb_cols,int sb_size_log2,int num_planes)

{
  int iVar1;
  byte bVar2;
  int local_2c;
  int sb_palette_toks;
  int sb_cols;
  int sb_rows;
  int sb_size_square;
  int sb_size;
  int shift;
  int num_planes_local;
  int sb_size_log2_local;
  int mb_cols_local;
  int mb_rows_local;
  
  bVar2 = (byte)sb_size_log2 - 4;
  iVar1 = 1 << ((byte)sb_size_log2 & 0x1f);
  local_2c = num_planes;
  if (2 < num_planes) {
    local_2c = 2;
  }
  return (mb_rows + (1 << (bVar2 & 0x1f)) + -1 >> (bVar2 & 0x1f)) *
         (mb_cols + (1 << (bVar2 & 0x1f)) + -1 >> (bVar2 & 0x1f)) * local_2c * iVar1 * iVar1;
}

Assistant:

static inline unsigned int get_token_alloc(int mb_rows, int mb_cols,
                                           int sb_size_log2,
                                           const int num_planes) {
  // Calculate the maximum number of max superblocks in the image.
  const int shift = sb_size_log2 - 4;
  const int sb_size = 1 << sb_size_log2;
  const int sb_size_square = sb_size * sb_size;
  const int sb_rows = CEIL_POWER_OF_TWO(mb_rows, shift);
  const int sb_cols = CEIL_POWER_OF_TWO(mb_cols, shift);

  // One palette token for each pixel. There can be palettes on two planes.
  const int sb_palette_toks = AOMMIN(2, num_planes) * sb_size_square;

  return sb_rows * sb_cols * sb_palette_toks;
}